

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

string * __thiscall
cmGeneratorExpressionEvaluationFile::FixRelativePath
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          string *relativePath,PathRole role,cmLocalGenerator *lg)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  char *pcVar3;
  PolicyID id;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  undefined1 local_1e0 [8];
  ostringstream w;
  string local_58 [8];
  string arg;
  cmLocalGenerator *lg_local;
  PathRole role_local;
  string *relativePath_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  string *resultPath;
  
  arg.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  PVar1 = this->PolicyStatusCMP0070;
  if (PVar1 != OLD) {
    if (PVar1 != WARN) {
      if (2 < PVar1 - NEW) {
        return __return_storage_ptr__;
      }
      if (role != PathForInput) {
        if (role != PathForOutput) {
          return __return_storage_ptr__;
        }
        pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
        cmsys::SystemTools::CollapseFullPath(&local_260,relativePath,pcVar3);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        return __return_storage_ptr__;
      }
      pcVar3 = cmLocalGenerator::GetCurrentSourceDirectory(lg);
      cmsys::SystemTools::CollapseFullPath(&local_240,relativePath,pcVar3);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string(local_58);
    if (role == PathForInput) {
      std::__cxx11::string::operator=(local_58,"INPUT");
    }
    else if (role == PathForOutput) {
      std::__cxx11::string::operator=(local_58,"OUTPUT");
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_200,(cmPolicies *)0x46,id);
    poVar2 = std::operator<<((ostream *)local_1e0,(string *)&local_200);
    poVar2 = std::operator<<(poVar2,"\nfile(GENERATE) given relative ");
    poVar2 = std::operator<<(poVar2,local_58);
    poVar2 = std::operator<<(poVar2," path:\n  ");
    poVar2 = std::operator<<(poVar2,(string *)relativePath);
    std::operator<<(poVar2,
                    "\nThis is not defined behavior unless CMP0070 is set to NEW.  For compatibility with older versions of CMake, the previous undefined behavior will be used."
                   );
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::ostringstream::str();
    cmLocalGenerator::IssueMessage(lg,AUTHOR_WARNING,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    std::__cxx11::string::~string(local_58);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)relativePath);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::FixRelativePath(
  std::string const& relativePath, PathRole role, cmLocalGenerator* lg)
{
  std::string resultPath;
  switch (this->PolicyStatusCMP0070) {
    case cmPolicies::WARN: {
      std::string arg;
      switch (role) {
        case PathForInput:
          arg = "INPUT";
          break;
        case PathForOutput:
          arg = "OUTPUT";
          break;
      }
      std::ostringstream w;
      /* clang-format off */
      w <<
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0070) << "\n"
        "file(GENERATE) given relative " << arg << " path:\n"
        "  " << relativePath << "\n"
        "This is not defined behavior unless CMP0070 is set to NEW.  "
        "For compatibility with older versions of CMake, the previous "
        "undefined behavior will be used."
        ;
      /* clang-format on */
      lg->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to use the relative path unchanged,
      // which ends up being used relative to the working dir.
      resultPath = relativePath;
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is to interpret the relative path with respect
      // to the current source or binary directory.
      switch (role) {
        case PathForInput:
          resultPath = cmSystemTools::CollapseFullPath(
            relativePath, lg->GetCurrentSourceDirectory());
          break;
        case PathForOutput:
          resultPath = cmSystemTools::CollapseFullPath(
            relativePath, lg->GetCurrentBinaryDirectory());
          break;
      }
      break;
  }
  return resultPath;
}